

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usage_config.cc
# Opt level: O1

FlagsUsageConfig * absl::flags_internal::GetUsageConfig(void)

{
  long lVar1;
  FlagsUsageConfig *in_RDI;
  _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_basic_string_view<char,_std::char_traits<char>_>
  *local_20;
  
  Mutex::Lock((Mutex *)&(anonymous_namespace)::custom_usage_config_guard);
  lVar1 = (anonymous_namespace)::custom_usage_config;
  if ((anonymous_namespace)::custom_usage_config == 0) {
    memset(in_RDI,0,0xa0);
    local_20 = anon_unknown_0::ContainsHelpshortFlags;
    std::function<bool(std::basic_string_view<char,std::char_traits<char>>)>::operator=
              ((function<bool(std::basic_string_view<char,std::char_traits<char>>)> *)in_RDI,
               (_func_bool_basic_string_view<char,_std::char_traits<char>_> **)&local_20);
    local_20 = anon_unknown_0::ContainsHelppackageFlags;
    std::function<bool(std::basic_string_view<char,std::char_traits<char>>)>::operator=
              ((function<bool(std::basic_string_view<char,std::char_traits<char>>)> *)
               &in_RDI->contains_help_flags,
               (_func_bool_basic_string_view<char,_std::char_traits<char>_> **)&local_20);
    local_20 = anon_unknown_0::ContainsHelppackageFlags;
    std::function<bool(std::basic_string_view<char,std::char_traits<char>>)>::operator=
              ((function<bool(std::basic_string_view<char,std::char_traits<char>>)> *)
               &in_RDI->contains_helppackage_flags,
               (_func_bool_basic_string_view<char,_std::char_traits<char>_> **)&local_20);
    local_20 = (anonymous_namespace)::VersionString_abi_cxx11_;
    std::function<std::__cxx11::string()>::operator=
              ((function<std::__cxx11::string()> *)&in_RDI->version_string,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_20
              );
    local_20 = (anonymous_namespace)::NormalizeFilename_abi_cxx11_;
    std::function<std::__cxx11::string(std::basic_string_view<char,std::char_traits<char>>)>::
    operator=((function<std::__cxx11::string(std::basic_string_view<char,std::char_traits<char>>)> *
              )&in_RDI->normalize_filename,&local_20);
  }
  else {
    (in_RDI->contains_helpshort_flags).super__Function_base._M_manager = (_Manager_type)0x0;
    (in_RDI->contains_helpshort_flags)._M_invoker = (_Invoker_type)0x0;
    *(undefined8 *)&(in_RDI->contains_helpshort_flags).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(in_RDI->contains_helpshort_flags).super__Function_base._M_functor + 8) =
         0;
    if (*(code **)(lVar1 + 0x10) != (code *)0x0) {
      (**(code **)(lVar1 + 0x10))();
      (in_RDI->contains_helpshort_flags)._M_invoker = *(_Invoker_type *)(lVar1 + 0x18);
      (in_RDI->contains_helpshort_flags).super__Function_base._M_manager =
           *(_Manager_type *)(lVar1 + 0x10);
    }
    (in_RDI->contains_help_flags).super__Function_base._M_manager = (_Manager_type)0x0;
    (in_RDI->contains_help_flags)._M_invoker = (_Invoker_type)0x0;
    *(undefined8 *)&(in_RDI->contains_help_flags).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(in_RDI->contains_help_flags).super__Function_base._M_functor + 8) = 0;
    if (*(code **)(lVar1 + 0x30) != (code *)0x0) {
      (**(code **)(lVar1 + 0x30))(&in_RDI->contains_help_flags,lVar1 + 0x20,2);
      (in_RDI->contains_help_flags)._M_invoker = *(_Invoker_type *)(lVar1 + 0x38);
      (in_RDI->contains_help_flags).super__Function_base._M_manager =
           *(_Manager_type *)(lVar1 + 0x30);
    }
    (in_RDI->contains_helppackage_flags).super__Function_base._M_manager = (_Manager_type)0x0;
    (in_RDI->contains_helppackage_flags)._M_invoker = (_Invoker_type)0x0;
    *(undefined8 *)&(in_RDI->contains_helppackage_flags).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(in_RDI->contains_helppackage_flags).super__Function_base._M_functor + 8)
         = 0;
    if (*(code **)(lVar1 + 0x50) != (code *)0x0) {
      (**(code **)(lVar1 + 0x50))(&in_RDI->contains_helppackage_flags,lVar1 + 0x40,2);
      (in_RDI->contains_helppackage_flags)._M_invoker = *(_Invoker_type *)(lVar1 + 0x58);
      (in_RDI->contains_helppackage_flags).super__Function_base._M_manager =
           *(_Manager_type *)(lVar1 + 0x50);
    }
    (in_RDI->version_string).super__Function_base._M_manager = (_Manager_type)0x0;
    (in_RDI->version_string)._M_invoker = (_Invoker_type)0x0;
    *(undefined8 *)&(in_RDI->version_string).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(in_RDI->version_string).super__Function_base._M_functor + 8) = 0;
    if (*(code **)(lVar1 + 0x70) != (code *)0x0) {
      (**(code **)(lVar1 + 0x70))(&in_RDI->version_string,lVar1 + 0x60,2);
      (in_RDI->version_string)._M_invoker = *(_Invoker_type *)(lVar1 + 0x78);
      (in_RDI->version_string).super__Function_base._M_manager = *(_Manager_type *)(lVar1 + 0x70);
    }
    (in_RDI->normalize_filename).super__Function_base._M_manager = (_Manager_type)0x0;
    (in_RDI->normalize_filename)._M_invoker = (_Invoker_type)0x0;
    *(undefined8 *)&(in_RDI->normalize_filename).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(in_RDI->normalize_filename).super__Function_base._M_functor + 8) = 0;
    if (*(code **)(lVar1 + 0x90) != (code *)0x0) {
      (**(code **)(lVar1 + 0x90))(&in_RDI->normalize_filename,lVar1 + 0x80,2);
      (in_RDI->normalize_filename)._M_invoker = *(_Invoker_type *)(lVar1 + 0x98);
      (in_RDI->normalize_filename).super__Function_base._M_manager =
           *(_Manager_type *)(lVar1 + 0x90);
    }
  }
  Mutex::Unlock((Mutex *)&(anonymous_namespace)::custom_usage_config_guard);
  return in_RDI;
}

Assistant:

FlagsUsageConfig GetUsageConfig() {
  absl::MutexLock l(&custom_usage_config_guard);

  if (custom_usage_config) return *custom_usage_config;

  FlagsUsageConfig default_config;
  default_config.contains_helpshort_flags = &ContainsHelpshortFlags;
  default_config.contains_help_flags = &ContainsHelppackageFlags;
  default_config.contains_helppackage_flags = &ContainsHelppackageFlags;
  default_config.version_string = &VersionString;
  default_config.normalize_filename = &NormalizeFilename;

  return default_config;
}